

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmState *this_01;
  string *psVar3;
  LinkType LVar4;
  allocator<char> local_1a9;
  string local_1a8;
  cmValue local_188;
  cmValue lss;
  cmAlphaNum local_168;
  cmAlphaNum local_138;
  undefined1 local_108 [8];
  string shared_link_type_flag_var;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  undefined1 local_80 [8];
  string static_link_type_flag_var;
  char *target_type_str;
  cmValue shared_link_type_flag;
  cmValue static_link_type_flag;
  allocator<char> local_31;
  string local_30;
  cmComputeLinkInformation *local_10;
  cmComputeLinkInformation *this_local;
  
  local_10 = this;
  this_01 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS",&local_31);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_01,&local_30);
  this->ArchivesMayBeShared = bVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this->LinkTypeEnabled = false;
  cmValue::cmValue(&shared_link_type_flag,(nullptr_t)0x0);
  cmValue::cmValue((cmValue *)&target_type_str,(nullptr_t)0x0);
  static_link_type_flag_var.field_2._8_8_ = 0;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    static_link_type_flag_var.field_2._8_8_ = (long)"_CREATE_WIN32_EXE" + 0xe;
  }
  else if (TVar2 == SHARED_LIBRARY) {
    static_link_type_flag_var.field_2._8_8_ = (long)"_CREATE_SHARED_LIBRARY" + 8;
  }
  else if (TVar2 == MODULE_LIBRARY) {
    static_link_type_flag_var.field_2._8_8_ = (long)"_CREATE_SHARED_MODULE" + 8;
  }
  if (static_link_type_flag_var.field_2._8_8_ != 0) {
    cmAlphaNum::cmAlphaNum(&local_b0,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_e0,(char *)static_link_type_flag_var.field_2._8_8_);
    cmStrCat<char[14],std::__cxx11::string,char[7]>
              ((string *)local_80,&local_b0,&local_e0,(char (*) [14])"_LINK_STATIC_",
               &this->LinkLanguage,(char (*) [7])0xc9223a);
    shared_link_type_flag_var.field_2._8_8_ =
         cmMakefile::GetDefinition(this->Makefile,(string *)local_80);
    shared_link_type_flag.Value = (string *)shared_link_type_flag_var.field_2._8_8_;
    cmAlphaNum::cmAlphaNum(&local_138,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_168,(char *)static_link_type_flag_var.field_2._8_8_);
    cmStrCat<char[15],std::__cxx11::string,char[7]>
              ((string *)local_108,&local_138,&local_168,(char (*) [15])"_LINK_DYNAMIC_",
               &this->LinkLanguage,(char (*) [7])0xc9223a);
    target_type_str = (char *)cmMakefile::GetDefinition(this->Makefile,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_80);
  }
  bVar1 = cmNonempty(shared_link_type_flag);
  if (bVar1) {
    lss.Value = (string *)target_type_str;
    bVar1 = cmNonempty((cmValue)target_type_str);
    if (bVar1) {
      this->LinkTypeEnabled = true;
      psVar3 = cmValue::operator*[abi_cxx11_(&shared_link_type_flag);
      std::__cxx11::string::operator=((string *)&this->StaticLinkTypeFlag,(string *)psVar3);
      psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)&target_type_str);
      std::__cxx11::string::operator=((string *)&this->SharedLinkTypeFlag,(string *)psVar3);
    }
  }
  this_00 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"LINK_SEARCH_START_STATIC",&local_1a9);
  local_188 = cmGeneratorTarget::GetProperty(this_00,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  bVar1 = cmIsOn(local_188);
  LVar4 = LinkShared;
  if (bVar1) {
    LVar4 = LinkStatic;
  }
  this->StartLinkType = LVar4;
  this->CurrentLinkType = this->StartLinkType;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  cmValue static_link_type_flag = nullptr;
  cmValue shared_link_type_flag = nullptr;
  const char* target_type_str = nullptr;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_STATIC_", this->LinkLanguage,
               "_FLAGS");
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_DYNAMIC_", this->LinkLanguage,
               "_FLAGS");
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (cmNonempty(static_link_type_flag) && cmNonempty(shared_link_type_flag)) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = *static_link_type_flag;
    this->SharedLinkTypeFlag = *shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = cmIsOn(lss) ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}